

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_drop.cpp
# Opt level: O2

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::TransformDrop(Transformer *this,PGDropStmt *stmt)

{
  int iVar1;
  long lVar2;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> _Var3;
  undefined1 uVar4;
  pointer pDVar5;
  PGList *pPVar6;
  ParserException *pPVar7;
  NotImplementedException *pNVar8;
  long in_RDX;
  optional_ptr<duckdb_libpgquery::PGList,_true> view_list;
  allocator local_49;
  anon_union_8_3_7edaf945_for_data local_48 [4];
  _Head_base<0UL,_duckdb::DropStatement_*,_false> local_28;
  
  make_uniq<duckdb::DropStatement>();
  pDVar5 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
           operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                       *)&local_28);
  lVar2 = *(long *)(in_RDX + 8);
  if (*(int *)(lVar2 + 4) != 1) {
    pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_48,"Can only drop one object at a time",(allocator *)&view_list);
    NotImplementedException::NotImplementedException(pNVar8,(string *)local_48);
    __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  _Var3._M_head_impl =
       (pDVar5->info).super_unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>.
       _M_t.super___uniq_ptr_impl<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DropInfo_*,_std::default_delete<duckdb::DropInfo>_>.
       super__Head_base<0UL,_duckdb::DropInfo_*,_false>._M_head_impl;
  iVar1 = *(int *)(in_RDX + 0x10);
  if (iVar1 == 0x13) {
    uVar4 = 0x1e;
  }
  else if (iVar1 == 0x14) {
    uVar4 = 0x1f;
  }
  else if (iVar1 == 0x30) {
    uVar4 = 3;
  }
  else {
    if (iVar1 == 0x21) {
      *(undefined1 *)((long)&(_Var3._M_head_impl)->super_ParseInfo + 9) = 2;
      view_list.ptr = (PGList *)**(undefined8 **)(lVar2 + 8);
      pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
      if (pPVar6->length == 2) {
        pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
        local_48[0] = pPVar6->head->data;
        optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                  ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_48);
        ::std::__cxx11::string::assign((char *)&(_Var3._M_head_impl)->catalog);
        pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
        local_48[0] = pPVar6->head->next->data;
        optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                  ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_48);
        ::std::__cxx11::string::assign((char *)&(_Var3._M_head_impl)->name);
      }
      else {
        pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
        if (pPVar6->length != 1) {
          pPVar7 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_48,"Expected \"catalog.schema\" or \"schema\"",&local_49);
          ParserException::ParserException(pPVar7,(string *)local_48);
          __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
        local_48[0] = pPVar6->head->data;
        optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                  ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_48);
        ::std::__cxx11::string::assign((char *)&(_Var3._M_head_impl)->name);
      }
      goto LAB_00668d88;
    }
    if (iVar1 == 0x22) {
      uVar4 = 6;
    }
    else if (iVar1 == 0x26) {
      uVar4 = 1;
    }
    else if (iVar1 == 0x2e) {
      uVar4 = 8;
    }
    else {
      if (iVar1 != 0x15) {
        pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_48,"Cannot drop this type yet",(allocator *)&view_list);
        NotImplementedException::NotImplementedException(pNVar8,(string *)local_48);
        __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar4 = 4;
    }
  }
  *(undefined1 *)((long)&(_Var3._M_head_impl)->super_ParseInfo + 9) = uVar4;
  view_list.ptr = (PGList *)**(undefined8 **)(lVar2 + 8);
  pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
  if (pPVar6->length == 3) {
    pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
    local_48[0] = pPVar6->head->data;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_48);
    ::std::__cxx11::string::assign((char *)&(_Var3._M_head_impl)->catalog);
    pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
    local_48[0] = pPVar6->head->next->data;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_48);
    ::std::__cxx11::string::assign((char *)&(_Var3._M_head_impl)->schema);
    pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
    local_48[0] = pPVar6->head->next->next->data;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_48);
    ::std::__cxx11::string::assign((char *)&(_Var3._M_head_impl)->name);
  }
  else {
    pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
    if (pPVar6->length == 2) {
      pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
      local_48[0] = pPVar6->head->data;
      optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_48);
      ::std::__cxx11::string::assign((char *)&(_Var3._M_head_impl)->schema);
      pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
      local_48[0] = pPVar6->head->next->data;
      optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_48);
      ::std::__cxx11::string::assign((char *)&(_Var3._M_head_impl)->name);
    }
    else {
      pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
      if (pPVar6->length != 1) {
        pPVar7 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_48,"Expected \"catalog.schema.name\", \"schema.name\"or \"name\""
                   ,&local_49);
        ParserException::ParserException(pPVar7,(string *)local_48);
        __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar6 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&view_list);
      local_48[0] = pPVar6->head->data;
      optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_48);
      ::std::__cxx11::string::assign((char *)&(_Var3._M_head_impl)->name);
    }
  }
LAB_00668d88:
  (_Var3._M_head_impl)->cascade = *(int *)(in_RDX + 0x14) == 1;
  (_Var3._M_head_impl)->if_not_found = *(OnEntryNotFound *)(in_RDX + 0x18);
  (this->parent).ptr = (Transformer *)local_28._M_head_impl;
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
}

Assistant:

unique_ptr<SQLStatement> Transformer::TransformDrop(duckdb_libpgquery::PGDropStmt &stmt) {
	auto result = make_uniq<DropStatement>();
	auto &info = *result->info.get();
	if (stmt.objects->length != 1) {
		throw NotImplementedException("Can only drop one object at a time");
	}
	switch (stmt.removeType) {
	case duckdb_libpgquery::PG_OBJECT_TABLE:
		info.type = CatalogType::TABLE_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_SCHEMA:
		info.type = CatalogType::SCHEMA_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_INDEX:
		info.type = CatalogType::INDEX_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_VIEW:
		info.type = CatalogType::VIEW_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_SEQUENCE:
		info.type = CatalogType::SEQUENCE_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_FUNCTION:
		info.type = CatalogType::MACRO_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_TABLE_MACRO:
		info.type = CatalogType::TABLE_MACRO_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_TYPE:
		info.type = CatalogType::TYPE_ENTRY;
		break;
	default:
		throw NotImplementedException("Cannot drop this type yet");
	}

	switch (stmt.removeType) {
	case duckdb_libpgquery::PG_OBJECT_SCHEMA: {
		auto view_list = PGPointerCast<duckdb_libpgquery::PGList>(stmt.objects->head->data.ptr_value);
		if (view_list->length == 2) {
			info.catalog = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->next->data.ptr_value)->val.str;
		} else if (view_list->length == 1) {
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
		} else {
			throw ParserException("Expected \"catalog.schema\" or \"schema\"");
		}
		break;
	}
	default: {
		auto view_list = PGPointerCast<duckdb_libpgquery::PGList>(stmt.objects->head->data.ptr_value);
		if (view_list->length == 3) {
			info.catalog = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
			info.schema = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->next->data.ptr_value)->val.str;
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->next->next->data.ptr_value)->val.str;
		} else if (view_list->length == 2) {
			info.schema = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->next->data.ptr_value)->val.str;
		} else if (view_list->length == 1) {
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
		} else {
			throw ParserException("Expected \"catalog.schema.name\", \"schema.name\"or \"name\"");
		}
		break;
	}
	}
	info.cascade = stmt.behavior == duckdb_libpgquery::PGDropBehavior::PG_DROP_CASCADE;
	info.if_not_found = TransformOnEntryNotFound(stmt.missing_ok);
	return std::move(result);
}